

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

void png_convert_from_time_t(png_timep ptime,time_t ttime)

{
  tm *ttime_00;
  time_t local_10;
  
  local_10 = ttime;
  ttime_00 = (tm *)gmtime(&local_10);
  png_convert_from_struct_tm(ptime,ttime_00);
  return;
}

Assistant:

void PNGAPI
png_convert_from_time_t(png_timep ptime, time_t ttime)
{
   struct tm *tbuf;

   png_debug(1, "in png_convert_from_time_t");

   tbuf = gmtime(&ttime);
   png_convert_from_struct_tm(ptime, tbuf);
}